

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmSourceFile.cxx
# Opt level: O2

void __thiscall cmSourceFile::SetProperty(cmSourceFile *this,string *prop,cmValue value)

{
  __type _Var1;
  cmListFileBacktrace lfbt;
  cmValue local_20;
  
  local_20.Value = value.Value;
  _Var1 = std::operator==(prop,&propINCLUDE_DIRECTORIES_abi_cxx11_);
  if (_Var1) {
    std::
    vector<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    ::clear(&this->IncludeDirectories);
    if (value.Value == (string *)0x0) {
      return;
    }
    cmMakefile::GetBacktrace((cmMakefile *)&stack0xffffffffffffffd0);
    std::vector<BT<std::__cxx11::string>,std::allocator<BT<std::__cxx11::string>>>::
    emplace_back<cmValue&,cmListFileBacktrace&>
              ((vector<BT<std::__cxx11::string>,std::allocator<BT<std::__cxx11::string>>> *)
               &this->IncludeDirectories,&stack0xffffffffffffffe0,
               (cmListFileBacktrace *)&stack0xffffffffffffffd0);
  }
  else {
    _Var1 = std::operator==(prop,&propCOMPILE_OPTIONS_abi_cxx11_);
    if (_Var1) {
      std::
      vector<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
      ::clear(&this->CompileOptions);
      if (value.Value == (string *)0x0) {
        return;
      }
      cmMakefile::GetBacktrace((cmMakefile *)&stack0xffffffffffffffd0);
      std::vector<BT<std::__cxx11::string>,std::allocator<BT<std::__cxx11::string>>>::
      emplace_back<cmValue&,cmListFileBacktrace&>
                ((vector<BT<std::__cxx11::string>,std::allocator<BT<std::__cxx11::string>>> *)
                 &this->CompileOptions,&stack0xffffffffffffffe0,
                 (cmListFileBacktrace *)&stack0xffffffffffffffd0);
    }
    else {
      _Var1 = std::operator==(prop,&propCOMPILE_DEFINITIONS_abi_cxx11_);
      if (!_Var1) {
        cmPropertyMap::SetProperty(&this->Properties,prop,value);
        return;
      }
      std::
      vector<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
      ::clear(&this->CompileDefinitions);
      if (value.Value == (string *)0x0) {
        return;
      }
      cmMakefile::GetBacktrace((cmMakefile *)&stack0xffffffffffffffd0);
      std::vector<BT<std::__cxx11::string>,std::allocator<BT<std::__cxx11::string>>>::
      emplace_back<cmValue&,cmListFileBacktrace&>
                ((vector<BT<std::__cxx11::string>,std::allocator<BT<std::__cxx11::string>>> *)
                 &this->CompileDefinitions,&stack0xffffffffffffffe0,
                 (cmListFileBacktrace *)&stack0xffffffffffffffd0);
    }
  }
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&stack0xffffffffffffffd8);
  return;
}

Assistant:

void cmSourceFile::SetProperty(const std::string& prop, cmValue value)
{
  if (prop == propINCLUDE_DIRECTORIES) {
    this->IncludeDirectories.clear();
    if (value) {
      cmListFileBacktrace lfbt = this->Location.GetMakefile()->GetBacktrace();
      this->IncludeDirectories.emplace_back(value, lfbt);
    }
  } else if (prop == propCOMPILE_OPTIONS) {
    this->CompileOptions.clear();
    if (value) {
      cmListFileBacktrace lfbt = this->Location.GetMakefile()->GetBacktrace();
      this->CompileOptions.emplace_back(value, lfbt);
    }
  } else if (prop == propCOMPILE_DEFINITIONS) {
    this->CompileDefinitions.clear();
    if (value) {
      cmListFileBacktrace lfbt = this->Location.GetMakefile()->GetBacktrace();
      this->CompileDefinitions.emplace_back(value, lfbt);
    }
  } else {
    this->Properties.SetProperty(prop, value);
  }
}